

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_bounding_box.cpp
# Opt level: O2

ON_3dPoint * __thiscall
ON_BoundingBox::FarPoint
          (ON_3dPoint *__return_storage_ptr__,ON_BoundingBox *this,ON_3dPoint *test_point)

{
  double dVar1;
  double dVar2;
  undefined1 auVar3 [16];
  double dVar4;
  double dVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  undefined1 auVar9 [16];
  
  dVar1 = (this->m_min).x;
  dVar2 = (this->m_min).y;
  dVar4 = (this->m_max).x;
  dVar5 = (this->m_max).y;
  uVar6 = -(ulong)(ABS(dVar1 - test_point->x) < ABS(dVar4 - test_point->x));
  uVar8 = -(ulong)(ABS(dVar2 - test_point->y) < ABS(dVar5 - test_point->y));
  uVar7 = (ulong)dVar5 & uVar8;
  auVar9._0_8_ = ~uVar6 & (ulong)dVar1;
  auVar9._8_8_ = ~uVar8 & (ulong)dVar2;
  auVar3._8_4_ = (int)uVar7;
  auVar3._0_8_ = (ulong)dVar4 & uVar6;
  auVar3._12_4_ = (int)(uVar7 >> 0x20);
  __return_storage_ptr__->x = (double)SUB168(auVar9 | auVar3,0);
  __return_storage_ptr__->y = (double)SUB168(auVar9 | auVar3,8);
  dVar1 = (this->m_min).z;
  dVar2 = (this->m_max).z;
  uVar7 = -(ulong)(ABS(dVar1 - test_point->z) < ABS(dVar2 - test_point->z));
  __return_storage_ptr__->z = (double)(~uVar7 & (ulong)dVar1 | (ulong)dVar2 & uVar7);
  return __return_storage_ptr__;
}

Assistant:

ON_3dPoint ON_BoundingBox::FarPoint( 
  const ON_3dPoint& test_point
  ) const
{
  ON_3dPoint far_point = test_point;
 // if ( IsValid() ) {
    far_point.x = ( fabs(m_min.x-test_point.x) >= fabs(m_max.x-test_point.x) )
                ? m_min.x : m_max.x;
    far_point.y = ( fabs(m_min.y-test_point.y) >= fabs(m_max.y-test_point.y) )
                ? m_min.y : m_max.y;
    far_point.z = ( fabs(m_min.z-test_point.z) >= fabs(m_max.z-test_point.z) )
                ? m_min.z : m_max.z;
//  }
  return far_point;
}